

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O0

void __thiscall
txpackage_tests::package_witness_swap_tests::test_method(package_witness_swap_tests *this)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_01;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_02;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_03;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_04;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_05;
  initializer_list<transaction_identifier<true>_> __l_06;
  bool bVar5;
  Txid *pTVar6;
  reference pvVar7;
  reference pvVar8;
  Wtxid *pWVar9;
  iterator output_amount;
  long in_FS_OFFSET;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_ffffffffffffd798;
  char *pcVar10;
  CTransaction *pCVar11;
  CKey *this_00;
  WitnessV0ScriptHash *in_stack_ffffffffffffd7a0;
  CMutableTransaction *pCVar12;
  CTxMemPool *this_01;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_ffffffffffffd7a8;
  uint uVar14;
  char *pcVar13;
  ChainstateManager *this_02;
  undefined4 uVar15;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *this_03;
  assertion_result *this_04;
  undefined4 in_stack_ffffffffffffd7b0;
  uint32_t in_stack_ffffffffffffd7b4;
  undefined4 in_stack_ffffffffffffd7b8;
  int in_stack_ffffffffffffd7bc;
  undefined7 in_stack_ffffffffffffd7c0;
  undefined1 in_stack_ffffffffffffd7c7;
  CMutableTransaction *in_stack_ffffffffffffd7c8;
  undefined7 in_stack_ffffffffffffd7d0;
  undefined1 in_stack_ffffffffffffd7d7;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_ffffffffffffd7d8;
  TestChain100Setup *in_stack_ffffffffffffd7e0;
  undefined7 in_stack_ffffffffffffd7e8;
  undefined1 in_stack_ffffffffffffd7ef;
  optional<CFeeRate> *in_stack_ffffffffffffd808;
  Package *in_stack_ffffffffffffd810;
  ChainstateManager *in_stack_ffffffffffffd818;
  undefined8 *puVar16;
  Chainstate *in_stack_ffffffffffffd820;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_ffffffffffffd828;
  CFeeRate *in_stack_ffffffffffffd888;
  undefined7 in_stack_ffffffffffffd890;
  undefined1 in_stack_ffffffffffffd897;
  undefined7 in_stack_ffffffffffffd8e8;
  undefined1 in_stack_ffffffffffffd8ef;
  undefined8 in_stack_ffffffffffffd8f0;
  PackageMempoolAcceptResult *in_stack_ffffffffffffd8f8;
  undefined7 in_stack_ffffffffffffd900;
  undefined1 in_stack_ffffffffffffd907;
  undefined8 in_stack_ffffffffffffd928;
  undefined1 uVar17;
  CKey *in_stack_ffffffffffffd930;
  undefined8 in_stack_ffffffffffffd938;
  CTransactionRef *in_stack_ffffffffffffd940;
  TestChain100Setup *in_stack_ffffffffffffd948;
  CScript *in_stack_ffffffffffffdad0;
  CScript *output_destination;
  CAmount in_stack_ffffffffffffdad8;
  undefined1 *local_23b8;
  undefined1 *local_2388;
  undefined1 *local_2370;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2180;
  undefined1 *local_20d8;
  undefined1 *local_20a8;
  undefined1 *local_2090;
  package_witness_swap_tests *this_local;
  const_string local_1ea8 [2];
  lazy_ostream local_1e88 [2];
  assertion_result local_1e68 [2];
  const_string local_1e30 [2];
  lazy_ostream local_1e10 [2];
  assertion_result local_1df0 [2];
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  expected_wtxids;
  const_string local_1d98 [2];
  lazy_ostream local_1d78 [2];
  assertion_result local_1d58 [2];
  const_string local_1d20 [2];
  lazy_ostream local_1d00 [2];
  assertion_result local_1ce0 [2];
  undefined8 local_1ca8;
  CFeeRate expected_feerate;
  undefined1 local_1c98 [16];
  undefined1 local_1c88 [64];
  const_string local_1c48 [2];
  lazy_ostream local_1c28 [2];
  assertion_result local_1c08 [2];
  const_string local_1bd0 [2];
  lazy_ostream local_1bb0 [2];
  assertion_result local_1b90 [2];
  const_string local_1b58 [2];
  lazy_ostream local_1b38 [2];
  assertion_result local_1b18 [2];
  const_string local_1ae0 [2];
  lazy_ostream local_1ac0 [2];
  assertion_result local_1aa0 [2];
  const_iterator it_child;
  const_iterator it_parent3;
  const_iterator it_parent2;
  const_iterator it_parent1;
  const_string local_1a48;
  lazy_ostream local_1a38 [2];
  assertion_result local_1a18 [2];
  CTransactionRef ptx_mixed_child;
  CMutableTransaction mtx_mixed_child;
  CKey mixed_grandchild_key;
  const_string local_1980 [2];
  lazy_ostream local_1960 [2];
  assertion_result local_1940 [2];
  const_string local_1908 [2];
  lazy_ostream local_18e8 [2];
  CAmount local_18c8;
  assertion_result local_18c0 [2];
  CTransactionRef ptx_parent3;
  CMutableTransaction mtx_parent3;
  const_string local_1820 [2];
  lazy_ostream local_1800 [2];
  assertion_result local_17e0 [2];
  CTransactionRef ptx_parent2_v2;
  CTransactionRef ptx_parent2_v1;
  CMutableTransaction mtx_parent2_v2;
  CMutableTransaction mtx_parent2_v1;
  CTransactionRef ptx_grandparent2;
  CMutableTransaction mtx_grandparent2;
  CScriptWitness parent2_witness2;
  CScriptWitness parent2_witness1;
  CTransactionRef ptx_parent1;
  CMutableTransaction mtx_parent1;
  CScriptWitness acs_witness;
  Package package_mixed;
  const_string local_15a8 [2];
  lazy_ostream local_1588 [2];
  assertion_result local_1568 [2];
  const_string local_1530 [2];
  lazy_ostream local_1510 [2];
  assertion_result local_14f0 [2];
  const_iterator it_grandchild;
  const_iterator it_child2_ignored;
  const_string local_14a8;
  lazy_ostream local_1498 [2];
  assertion_result local_1478 [2];
  Package package_child2_grandchild;
  const_string local_1420 [2];
  lazy_ostream local_1400 [6];
  assertion_result local_13a0 [2];
  CTransactionRef ptx_grandchild;
  CMutableTransaction mtx_grandchild;
  CKey grandchild_key;
  const_string local_12f0 [2];
  lazy_ostream local_12d0 [2];
  assertion_result local_12b0 [2];
  const_string local_1278 [2];
  lazy_ostream local_1258 [2];
  assertion_result local_1238 [2];
  const_iterator it_child_dup;
  const_iterator it_parent_dup;
  const_string local_11f0;
  lazy_ostream local_11e0 [2];
  assertion_result local_11c0 [2];
  undefined1 local_1188 [16];
  undefined1 local_1178 [64];
  const_string local_1138 [2];
  lazy_ostream local_1118 [2];
  assertion_result local_10f8 [2];
  const_string local_10c0 [2];
  lazy_ostream local_10a0 [2];
  assertion_result local_1080 [2];
  const_iterator it_child2;
  const_iterator it_parent2_deduped;
  const_string local_1038;
  lazy_ostream local_1028 [2];
  assertion_result local_1008 [2];
  Package package_parent_child2;
  const_string local_fb0;
  lazy_ostream local_fa0 [2];
  assertion_result local_f80 [2];
  Package package_parent_child1;
  const_string local_f28 [2];
  lazy_ostream local_f08 [6];
  assertion_result local_ea8 [2];
  const_string local_e70 [2];
  lazy_ostream local_e50 [2];
  assertion_result local_e30 [2];
  undefined1 local_df8 [16];
  undefined1 local_de8 [64];
  CTransactionRef ptx_child2;
  CTransactionRef ptx_child1;
  CMutableTransaction mtx_child2;
  CMutableTransaction mtx_child1;
  CKey child_key;
  CScriptWitness witness2;
  CScriptWitness witness1;
  CTransactionRef ptx_parent;
  CMutableTransaction mtx_parent;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock18;
  undefined8 local_bb8 [5];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_mixed;
  PackageMempoolAcceptResult mixed_result;
  CScript mixed_child_spk;
  undefined1 local_9b8 [32];
  MempoolAcceptResult parent2_v2_result;
  CTransaction local_898;
  CScript grandparent2_spk;
  CScript grandparent2_script;
  CKey local_7a8 [9];
  CScript acs_spk;
  CScript acs_script;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_spend_ignored;
  PackageMempoolAcceptResult submit_spend_ignored;
  undefined1 local_610 [32];
  undefined1 local_5f0 [32];
  undefined1 local_5d0 [32];
  undefined1 local_5b0 [32];
  undefined1 local_590 [32];
  CTransaction local_570;
  CScript grandchild_locking_script;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_segwit_dedup;
  PackageMempoolAcceptResult submit_segwit_dedup;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_witness2;
  PackageMempoolAcceptResult submit_witness2;
  undefined1 local_348 [32];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_witness1;
  PackageMempoolAcceptResult submit_witness1;
  undefined1 local_288 [32];
  undefined1 local_268 [32];
  undefined1 local_248 [32];
  undefined1 local_228 [32];
  undefined1 local_208 [32];
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  CScript child_locking_script;
  CTransaction local_f8;
  CScript scriptPubKey;
  CScript witnessScript;
  
  local_1008[0].m_message.px = (element_type *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TestChain100Setup::mineBlocks
            (in_stack_ffffffffffffd7e0,(int)((ulong)in_stack_ffffffffffffd7d8 >> 0x20));
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffd798,0);
  TestChain100Setup::MockMempoolMinFee
            ((TestChain100Setup *)CONCAT17(in_stack_ffffffffffffd897,in_stack_ffffffffffffd890),
             in_stack_ffffffffffffd888);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd798);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffd7d8,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
             (char *)in_stack_ffffffffffffd7c8,
             (char *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0),
             in_stack_ffffffffffffd7bc,SUB41((uint)in_stack_ffffffffffffd7b8 >> 0x18,0));
  CScript::CScript((CScript *)in_stack_ffffffffffffd798);
  CScript::operator<<((CScript *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                      (opcodetype)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
  CScript::operator<<((CScript *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                      (opcodetype)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
  CScript::CScript((CScript *)in_stack_ffffffffffffd798,(CScript *)0xb70fe3);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd798);
  WitnessV0ScriptHash::WitnessV0ScriptHash
            ((WitnessV0ScriptHash *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0),
             (CScript *)CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8));
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<WitnessV0ScriptHash,void,void,WitnessV0ScriptHash,void>
            (in_stack_ffffffffffffd7a8,in_stack_ffffffffffffd7a0);
  GetScriptForDestination(in_stack_ffffffffffffd798);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant(in_stack_ffffffffffffd798);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffd7a8,(size_type)in_stack_ffffffffffffd7a0);
  uVar14 = (uint)((ulong)in_stack_ffffffffffffd7a8 >> 0x20);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffd798,
             (shared_ptr<const_CTransaction> *)0xb71072);
  CKey::CKey((CKey *)in_stack_ffffffffffffd7c8,
             (CKey *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
  CScript::CScript((CScript *)in_stack_ffffffffffffd798,(CScript *)0xb710a5);
  pCVar12 = (CMutableTransaction *)&DAT_124101100;
  pcVar10 = (char *)&local_f8;
  pcVar13 = (char *)((ulong)uVar14 << 0x20);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffd948,in_stack_ffffffffffffd940,
             (uint32_t)((ulong)in_stack_ffffffffffffd938 >> 0x20),(int)in_stack_ffffffffffffd938,
             in_stack_ffffffffffffd930,in_stack_ffffffffffffdad0,in_stack_ffffffffffffdad8,
             SUB81((ulong)in_stack_ffffffffffffd928 >> 0x38,0));
  CScript::~CScript((CScript *)pcVar10);
  CKey::~CKey((CKey *)pcVar10);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar10);
  MakeTransactionRef<CMutableTransaction&>(pCVar12);
  CScriptWitness::CScriptWitness((CScriptWitness *)pcVar10);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8),
                      (int *)CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar12);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::end
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar12);
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::
  emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
            ((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8),
             (iterator *)CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0),
             (iterator *)pcVar13);
  CScriptWitness::CScriptWitness((CScriptWitness *)pcVar10,(CScriptWitness *)0xb711fe);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8),
                      (int *)CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar12);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::end
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar12);
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::
  emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
            ((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8),
             (iterator *)CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0),
             (iterator *)pcVar13);
  GenerateRandomKey(SUB81((ulong)pCVar12 >> 0x38,0));
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
  WitnessV0KeyHash::WitnessV0KeyHash
            ((WitnessV0KeyHash *)CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0),
             (CPubKey *)pcVar13);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<WitnessV0KeyHash,void,void,WitnessV0KeyHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)pcVar13,(WitnessV0KeyHash *)pCVar12);
  GetScriptForDestination((CTxDestination *)pcVar10);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)pcVar10);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)pcVar10);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8),
             CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pcVar10);
  pTVar6 = CTransaction::GetHash((CTransaction *)pcVar10);
  pvVar7 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)pcVar13,(size_type)pCVar12);
  uVar2 = *(undefined8 *)(pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uVar3 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  uVar4 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)((pvVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)((pvVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uVar4;
  *(undefined8 *)(pvVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar2;
  *(undefined8 *)((pvVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uVar3;
  pvVar7 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)pcVar13,(size_type)pCVar12);
  (pvVar7->prevout).n = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1e8 = 0;
  uStack_1e0 = 0;
  CScript::CScript((CScript *)pcVar10);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)pcVar13,(size_type)pCVar12);
  CScript::operator=((CScript *)pcVar13,(CScript *)pCVar12);
  CScript::~CScript((CScript *)pcVar10);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)pcVar13,(size_type)pCVar12);
  CScriptWitness::operator=((CScriptWitness *)pcVar13,(CScriptWitness *)pCVar12);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8),
             CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0));
  pvVar8 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)pcVar13,(size_type)pCVar12);
  pvVar8->nValue = (CAmount)&DAT_11e1a3000;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)pcVar13,(size_type)pCVar12);
  CScript::operator=((CScript *)pcVar13,(CScript *)pCVar12);
  CMutableTransaction::CMutableTransaction
            (in_stack_ffffffffffffd7c8,
             (CMutableTransaction *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)pcVar13,(size_type)pCVar12);
  CScriptWitness::operator=((CScriptWitness *)pcVar13,(CScriptWitness *)pCVar12);
  MakeTransactionRef<CMutableTransaction&>(pCVar12);
  MakeTransactionRef<CMutableTransaction&>(pCVar12);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar10)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
               (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
               (size_t)in_stack_ffffffffffffd7c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar12,(char (*) [1])pcVar10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar10);
    pTVar6 = CTransaction::GetHash((CTransaction *)pcVar10);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar10);
    pCVar12 = (CMutableTransaction *)CTransaction::GetHash((CTransaction *)pcVar10);
    pcVar13 = "ptx_child2->GetHash()";
    pcVar10 = "ptx_child1->GetHash()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<false>,transaction_identifier<false>>
              (local_de8,local_df8,0x21f,1,2,pTVar6);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar10);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar10)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
               (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
               (size_t)in_stack_ffffffffffffd7c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar10);
    CTransaction::GetWitnessHash((CTransaction *)pcVar10);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar10);
    CTransaction::GetWitnessHash((CTransaction *)pcVar10);
    transaction_identifier<true>::operator!=
              ((transaction_identifier<true> *)pcVar13,(transaction_identifier<true> *)pCVar12);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pcVar13,SUB81((ulong)pCVar12 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
    boost::unit_test::operator<<((lazy_ostream *)pCVar12,(basic_cstring<const_char> *)pcVar10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
    pcVar10 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e30,local_e50,local_e70,0x221,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar10);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar10);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar10)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
               (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
               (size_t)in_stack_ffffffffffffd7c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)pcVar10,(shared_ptr<const_CTransaction> *)0xb718b8)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)pcVar10,(shared_ptr<const_CTransaction> *)0xb718cd)
    ;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)pcVar10);
    __l._M_len._0_7_ = in_stack_ffffffffffffd7e8;
    __l._M_array = (iterator)in_stack_ffffffffffffd7e0;
    __l._M_len._7_1_ = in_stack_ffffffffffffd7ef;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(in_stack_ffffffffffffd7d8,__l,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0));
    GetPackageHash(in_stack_ffffffffffffd828);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)pcVar10,(shared_ptr<const_CTransaction> *)0xb71959)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)pcVar10,(shared_ptr<const_CTransaction> *)0xb7196e)
    ;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)pcVar10);
    __l_00._M_len._0_7_ = in_stack_ffffffffffffd7e8;
    __l_00._M_array = (iterator)in_stack_ffffffffffffd7e0;
    __l_00._M_len._7_1_ = in_stack_ffffffffffffd7ef;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(in_stack_ffffffffffffd7d8,__l_00,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0));
    GetPackageHash(in_stack_ffffffffffffd828);
    ::operator!=((base_blob<256U> *)pcVar13,(base_blob<256U> *)pCVar12);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pcVar13,SUB81((ulong)pCVar12 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
    boost::unit_test::operator<<((lazy_ostream *)pCVar12,(basic_cstring<const_char> *)pcVar10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
    pcVar10 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ea8,local_f08,local_f28,0x223,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar10);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar10);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)pcVar13);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)pcVar10);
    local_2090 = local_248;
    do {
      local_2090 = local_2090 + -0x10;
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar10);
    } while (local_2090 != local_268);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)pcVar13);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)pcVar10);
    local_20a8 = local_208;
    do {
      local_20a8 = local_20a8 + -0x10;
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar10);
    } while (local_20a8 != local_228);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pcVar10,(shared_ptr<const_CTransaction> *)0xb71be5);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pcVar10,(shared_ptr<const_CTransaction> *)0xb71bfa);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)pcVar10);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffd7e8;
  __l_01._M_array = (iterator)in_stack_ffffffffffffd7e0;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffd7ef;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(in_stack_ffffffffffffd7d8,__l_01,
           (allocator_type *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0));
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)pcVar10);
  local_20d8 = local_268;
  do {
    local_20d8 = local_20d8 + -0x10;
    std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar10);
  } while (local_20d8 != local_288);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar10);
  ChainstateManager::ActiveChainstate((ChainstateManager *)pcVar13);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar13);
  std::optional<CFeeRate>::optional((optional<CFeeRate> *)pcVar10);
  ProcessNewPackage(in_stack_ffffffffffffd820,(CTxMemPool *)in_stack_ffffffffffffd818,
                    in_stack_ffffffffffffd810,(bool)in_stack_ffffffffffffd897,
                    in_stack_ffffffffffffd808);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::get
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar10);
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((Package *)CONCAT17(in_stack_ffffffffffffd907,in_stack_ffffffffffffd900),
             in_stack_ffffffffffffd8f8,SUB81((ulong)in_stack_ffffffffffffd8f0 >> 0x38,0),
             (CTxMemPool *)CONCAT17(in_stack_ffffffffffffd8ef,in_stack_ffffffffffffd8e8));
  bVar5 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)pcVar10);
  if (bVar5) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                 (size_t)in_stack_ffffffffffffd7c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar13,SUB81((ulong)pCVar12 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar13);
      boost::unit_test::operator<<
                ((lazy_ostream *)pCVar12,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
      pcVar10 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_f80,local_fa0,&local_fb0,0x22c,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)pcVar10);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar10);
      bVar5 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar5);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar10);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pcVar10,(shared_ptr<const_CTransaction> *)0xb72445);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pcVar10,(shared_ptr<const_CTransaction> *)0xb7245a);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)pcVar10);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffd7e8;
  __l_02._M_array = (iterator)in_stack_ffffffffffffd7e0;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffd7ef;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(in_stack_ffffffffffffd7d8,__l_02,
           (allocator_type *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0));
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)pcVar10);
  local_2180 = &err_witness1;
  do {
    local_2180 = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&local_2180[-1].
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 0x18);
    std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar10);
  } while (local_2180 !=
           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_348);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar10);
  ChainstateManager::ActiveChainstate((ChainstateManager *)pcVar13);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar13);
  std::optional<CFeeRate>::optional((optional<CFeeRate> *)pcVar10);
  ProcessNewPackage(in_stack_ffffffffffffd820,(CTxMemPool *)in_stack_ffffffffffffd818,
                    in_stack_ffffffffffffd810,(bool)in_stack_ffffffffffffd897,
                    in_stack_ffffffffffffd808);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::get
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar10);
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((Package *)CONCAT17(in_stack_ffffffffffffd907,in_stack_ffffffffffffd900),
             in_stack_ffffffffffffd8f8,SUB81((ulong)in_stack_ffffffffffffd8f0 >> 0x38,0),
             (CTxMemPool *)CONCAT17(in_stack_ffffffffffffd8ef,in_stack_ffffffffffffd8e8));
  bVar5 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)pcVar10);
  if (bVar5) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                 (size_t)in_stack_ffffffffffffd7c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar13,SUB81((ulong)pCVar12 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar13);
      boost::unit_test::operator<<
                ((lazy_ostream *)pCVar12,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
      pcVar10 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1008,local_1028,&local_1038,0x234,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)pcVar10);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar10);
      bVar5 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar5);
  }
  else {
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar10);
    CTransaction::GetWitnessHash((CTransaction *)pcVar10);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar10);
    std::
    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            *)pCVar12,(key_type *)pcVar10);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar10);
    CTransaction::GetWitnessHash((CTransaction *)pcVar10);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar10);
    it_child2 = std::
                map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)pCVar12,(key_type *)pcVar10);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                 (size_t)in_stack_ffffffffffffd7c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar10)
      ;
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar13,SUB81((ulong)pCVar12 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
      boost::unit_test::operator<<((lazy_ostream *)pCVar12,(basic_cstring<const_char> *)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
      pcVar10 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1080,local_10a0,local_10c0,0x238,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar10);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar10);
      bVar5 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar5);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                 (size_t)in_stack_ffffffffffffd7c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar10)
      ;
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar13,SUB81((ulong)pCVar12 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
      boost::unit_test::operator<<((lazy_ostream *)pCVar12,(basic_cstring<const_char> *)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
      pcVar10 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_10f8,local_1118,local_1138,0x239,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar10);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar10);
      bVar5 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar5);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                 (size_t)in_stack_ffffffffffffd7c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)pCVar12,(char (*) [1])pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)pcVar10);
      pWVar9 = CTransaction::GetWitnessHash((CTransaction *)pcVar10);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar10)
      ;
      pCVar12 = (CMutableTransaction *)std::optional<uint256>::value((optional<uint256> *)pcVar13);
      pcVar13 = "it_child2->second.m_other_wtxid.value()";
      pcVar10 = "ptx_child1->GetWitnessHash()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<true>,uint256>
                (local_1178,local_1188,0x23a,1,2,pWVar9);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar10);
      bVar5 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar5);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar10);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar10);
  ChainstateManager::ActiveChainstate((ChainstateManager *)pcVar13);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar13);
  std::optional<CFeeRate>::optional((optional<CFeeRate> *)pcVar10);
  ProcessNewPackage(in_stack_ffffffffffffd820,(CTxMemPool *)in_stack_ffffffffffffd818,
                    in_stack_ffffffffffffd810,(bool)in_stack_ffffffffffffd897,
                    in_stack_ffffffffffffd808);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::get
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar10);
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((Package *)CONCAT17(in_stack_ffffffffffffd907,in_stack_ffffffffffffd900),
             in_stack_ffffffffffffd8f8,SUB81((ulong)in_stack_ffffffffffffd8f0 >> 0x38,0),
             (CTxMemPool *)CONCAT17(in_stack_ffffffffffffd8ef,in_stack_ffffffffffffd8e8));
  bVar5 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)pcVar10);
  if (bVar5) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                 (size_t)in_stack_ffffffffffffd7c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar13,SUB81((ulong)pCVar12 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar13);
      boost::unit_test::operator<<
                ((lazy_ostream *)pCVar12,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
      pcVar10 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_11c0,local_11e0,&local_11f0,0x242,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)pcVar10);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar10);
      bVar5 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar5);
  }
  else {
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar10);
    CTransaction::GetWitnessHash((CTransaction *)pcVar10);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar10);
    std::
    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            *)pCVar12,(key_type *)pcVar10);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar10);
    CTransaction::GetWitnessHash((CTransaction *)pcVar10);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar10);
    it_child_dup = std::
                   map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                   ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                           *)pCVar12,(key_type *)pcVar10);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                 (size_t)in_stack_ffffffffffffd7c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar10)
      ;
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar13,SUB81((ulong)pCVar12 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
      boost::unit_test::operator<<((lazy_ostream *)pCVar12,(basic_cstring<const_char> *)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
      pcVar10 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1238,local_1258,local_1278,0x246,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar10);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar10);
      bVar5 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar5);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                 (size_t)in_stack_ffffffffffffd7c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar10)
      ;
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar13,SUB81((ulong)pCVar12 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
      boost::unit_test::operator<<((lazy_ostream *)pCVar12,(basic_cstring<const_char> *)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)pCVar12,(unsigned_long)pcVar10);
      pcVar10 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_12b0,local_12d0,local_12f0,0x247,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar10);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar10);
      bVar5 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar5);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar10);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)pcVar10);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)pcVar10);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)pcVar13);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)pcVar10);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)pcVar13);
  GenerateRandomKey(SUB81((ulong)pCVar12 >> 0x38,0));
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
  WitnessV0KeyHash::WitnessV0KeyHash
            ((WitnessV0KeyHash *)CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0),
             (CPubKey *)pcVar13);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<WitnessV0KeyHash,void,void,WitnessV0KeyHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)pcVar13,(WitnessV0KeyHash *)pCVar12);
  GetScriptForDestination((CTxDestination *)pcVar10);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)pcVar10);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pcVar10,(shared_ptr<const_CTransaction> *)0xb7363c);
  CKey::CKey((CKey *)in_stack_ffffffffffffd7c8,
             (CKey *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
  CScript::CScript((CScript *)pcVar10,(CScript *)0xb73668);
  pCVar12 = (CMutableTransaction *)&DAT_118244f00;
  pCVar11 = &local_570;
  this_02 = (ChainstateManager *)((ulong)pcVar13 & 0xffffffff00000000);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffd948,in_stack_ffffffffffffd940,
             (uint32_t)((ulong)in_stack_ffffffffffffd938 >> 0x20),(int)in_stack_ffffffffffffd938,
             in_stack_ffffffffffffd930,in_stack_ffffffffffffdad0,in_stack_ffffffffffffdad8,
             SUB81((ulong)in_stack_ffffffffffffd928 >> 0x38,0));
  CScript::~CScript((CScript *)pCVar11);
  CKey::~CKey((CKey *)pCVar11);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pCVar11);
  MakeTransactionRef<CMutableTransaction&>(pCVar12);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,(pointer)pCVar12,(unsigned_long)pCVar11);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar11)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
               (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
               (size_t)in_stack_ffffffffffffd7c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)pCVar11,(shared_ptr<const_CTransaction> *)0xb73774)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)pCVar11,(shared_ptr<const_CTransaction> *)0xb73789)
    ;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)pCVar11);
    __l_03._M_len._0_7_ = in_stack_ffffffffffffd7e8;
    __l_03._M_array = (iterator)in_stack_ffffffffffffd7e0;
    __l_03._M_len._7_1_ = in_stack_ffffffffffffd7ef;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(in_stack_ffffffffffffd7d8,__l_03,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0));
    GetPackageHash(in_stack_ffffffffffffd828);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)pCVar11,(shared_ptr<const_CTransaction> *)0xb73815)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)pCVar11,(shared_ptr<const_CTransaction> *)0xb7382a)
    ;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)pCVar11);
    __l_04._M_len._0_7_ = in_stack_ffffffffffffd7e8;
    __l_04._M_array = (iterator)in_stack_ffffffffffffd7e0;
    __l_04._M_len._7_1_ = in_stack_ffffffffffffd7ef;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(in_stack_ffffffffffffd7d8,__l_04,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0));
    GetPackageHash(in_stack_ffffffffffffd828);
    ::operator!=((base_blob<256U> *)this_02,(base_blob<256U> *)pCVar12);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_02,SUB81((ulong)pCVar12 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,(pointer)pCVar12,(unsigned_long)pCVar11);
    boost::unit_test::operator<<((lazy_ostream *)pCVar12,(basic_cstring<const_char> *)pCVar11);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,(pointer)pCVar12,(unsigned_long)pCVar11);
    pCVar11 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_13a0,local_1400,local_1420,0x25a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar11);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar11);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_02);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)pCVar11);
    local_2370 = local_5d0;
    do {
      local_2370 = local_2370 + -0x10;
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pCVar11);
    } while (local_2370 != local_5f0);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_02);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)pCVar11);
    local_2388 = local_590;
    do {
      local_2388 = local_2388 + -0x10;
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pCVar11);
    } while (local_2388 != local_5b0);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pCVar11,(shared_ptr<const_CTransaction> *)0xb73aa1);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pCVar11,(shared_ptr<const_CTransaction> *)0xb73ab6);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)pCVar11);
  __l_05._M_len._0_7_ = in_stack_ffffffffffffd7e8;
  __l_05._M_array = (iterator)in_stack_ffffffffffffd7e0;
  __l_05._M_len._7_1_ = in_stack_ffffffffffffd7ef;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(in_stack_ffffffffffffd7d8,__l_05,
           (allocator_type *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0));
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)pCVar11);
  local_23b8 = local_5f0;
  do {
    local_23b8 = local_23b8 + -0x10;
    std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pCVar11);
  } while (local_23b8 != local_610);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pCVar11);
  ChainstateManager::ActiveChainstate(this_02);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)this_02);
  std::optional<CFeeRate>::optional((optional<CFeeRate> *)pCVar11);
  ProcessNewPackage(in_stack_ffffffffffffd820,(CTxMemPool *)in_stack_ffffffffffffd818,
                    in_stack_ffffffffffffd810,(bool)in_stack_ffffffffffffd897,
                    in_stack_ffffffffffffd808);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::get
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pCVar11);
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((Package *)CONCAT17(in_stack_ffffffffffffd907,in_stack_ffffffffffffd900),
             in_stack_ffffffffffffd8f8,SUB81((ulong)in_stack_ffffffffffffd8f0 >> 0x38,0),
             (CTxMemPool *)CONCAT17(in_stack_ffffffffffffd8ef,in_stack_ffffffffffffd8e8));
  bVar5 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)pCVar11);
  if (bVar5) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,(pointer)pCVar12,(unsigned_long)pCVar11);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pCVar11);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                 (size_t)in_stack_ffffffffffffd7c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)this_02,SUB81((ulong)pCVar12 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_02);
      boost::unit_test::operator<<
                ((lazy_ostream *)pCVar12,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar11);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,(pointer)pCVar12,(unsigned_long)pCVar11);
      pCVar11 = (CTransaction *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1478,local_1498,&local_14a8,0x261,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)pCVar11);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar11);
      bVar5 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar5);
  }
  else {
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pCVar11);
    CTransaction::GetWitnessHash(pCVar11);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pCVar11);
    std::
    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            *)pCVar12,(key_type *)pCVar11);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pCVar11);
    CTransaction::GetWitnessHash(pCVar11);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pCVar11);
    it_grandchild =
         std::
         map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
         ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                 *)pCVar12,(key_type *)pCVar11);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,(pointer)pCVar12,(unsigned_long)pCVar11);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pCVar11);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                 (size_t)in_stack_ffffffffffffd7c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pCVar11)
      ;
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)this_02,SUB81((ulong)pCVar12 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,(pointer)pCVar12,(unsigned_long)pCVar11);
      boost::unit_test::operator<<((lazy_ostream *)pCVar12,(basic_cstring<const_char> *)pCVar11);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,(pointer)pCVar12,(unsigned_long)pCVar11);
      pCVar11 = (CTransaction *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_14f0,local_1510,local_1530,0x265,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pCVar11);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar11);
      bVar5 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar5);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,(pointer)pCVar12,(unsigned_long)pCVar11);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pCVar11);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                 (size_t)in_stack_ffffffffffffd7c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pCVar11)
      ;
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)this_02,SUB81((ulong)pCVar12 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,(pointer)pCVar12,(unsigned_long)pCVar11);
      boost::unit_test::operator<<((lazy_ostream *)pCVar12,(basic_cstring<const_char> *)pCVar11);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,(pointer)pCVar12,(unsigned_long)pCVar11);
      pCVar11 = (CTransaction *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1568,local_1588,local_15a8,0x266,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pCVar11);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar11);
      bVar5 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar5);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pCVar11);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)pCVar11);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)this_02);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)pCVar11);
  CScript::CScript((CScript *)pCVar11);
  CScript::operator<<((CScript *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                      (opcodetype)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
  CScript::CScript((CScript *)pCVar11,(CScript *)0xb74667);
  CScript::~CScript((CScript *)pCVar11);
  WitnessV0ScriptHash::WitnessV0ScriptHash
            ((WitnessV0ScriptHash *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0),
             (CScript *)CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8));
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<WitnessV0ScriptHash,void,void,WitnessV0ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)this_02,(WitnessV0ScriptHash *)pCVar12);
  GetScriptForDestination((CTxDestination *)pCVar11);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)pCVar11);
  CScriptWitness::CScriptWitness((CScriptWitness *)pCVar11);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar12);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::end
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar12);
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::
  emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
            ((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8),
             (iterator *)CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0),
             (iterator *)this_02);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)this_02,(size_type)pCVar12);
  uVar15 = (undefined4)((ulong)this_02 >> 0x20);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pCVar11,(shared_ptr<const_CTransaction> *)0xb74779);
  CKey::CKey((CKey *)in_stack_ffffffffffffd7c8,
             (CKey *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
  CScript::CScript((CScript *)pCVar11,(CScript *)0xb747ac);
  pCVar12 = (CMutableTransaction *)&DAT_124101100;
  this_00 = local_7a8;
  this_03 = (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)CONCAT44(uVar15,1);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffd948,in_stack_ffffffffffffd940,
             (uint32_t)((ulong)in_stack_ffffffffffffd938 >> 0x20),(int)in_stack_ffffffffffffd938,
             in_stack_ffffffffffffd930,in_stack_ffffffffffffdad0,in_stack_ffffffffffffdad8,
             SUB81((ulong)in_stack_ffffffffffffd928 >> 0x38,0));
  CScript::~CScript((CScript *)this_00);
  CKey::~CKey(this_00);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_00);
  MakeTransactionRef<CMutableTransaction&>(pCVar12);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_03,(value_type *)pCVar12);
  CScript::CScript((CScript *)this_00);
  CScript::operator<<((CScript *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                      (opcodetype)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
  CScript::operator<<((CScript *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                      (opcodetype)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
  CScript::CScript((CScript *)this_00,(CScript *)0xb748c8);
  CScript::~CScript((CScript *)this_00);
  WitnessV0ScriptHash::WitnessV0ScriptHash
            ((WitnessV0ScriptHash *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0),
             (CScript *)CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8));
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<WitnessV0ScriptHash,void,void,WitnessV0ScriptHash,void>
            (this_03,(WitnessV0ScriptHash *)pCVar12);
  GetScriptForDestination((CTxDestination *)this_00);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)this_00);
  CScriptWitness::CScriptWitness((CScriptWitness *)this_00);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8),
                      (int *)CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar12);
  output_amount =
       prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                 ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar12);
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::
  emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
            ((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8),
             (iterator *)CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0),
             (iterator *)this_03);
  output_destination = (CScript *)&parent2_witness2;
  CScriptWitness::CScriptWitness((CScriptWitness *)this_00);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8),
                      (int *)CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar12);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::end
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar12);
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::
  emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
            ((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8),
             (iterator *)CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0),
             (iterator *)this_03);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)this_03,(size_type)pCVar12);
  uVar15 = (undefined4)((ulong)this_03 >> 0x20);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)this_00,(shared_ptr<const_CTransaction> *)0xb74ac0);
  CKey::CKey((CKey *)in_stack_ffffffffffffd7c8,
             (CKey *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
  CScript::CScript((CScript *)this_00,(CScript *)0xb74af3);
  pCVar12 = (CMutableTransaction *)&DAT_124101100;
  pCVar11 = &local_898;
  this_04 = (assertion_result *)CONCAT44(uVar15,1);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffd948,in_stack_ffffffffffffd940,
             (uint32_t)((ulong)in_stack_ffffffffffffd938 >> 0x20),(int)in_stack_ffffffffffffd938,
             in_stack_ffffffffffffd930,output_destination,(CAmount)output_amount.ptr,
             SUB81((ulong)in_stack_ffffffffffffd928 >> 0x38,0));
  CScript::~CScript((CScript *)pCVar11);
  CKey::~CKey((CKey *)pCVar11);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pCVar11);
  MakeTransactionRef<CMutableTransaction&>(pCVar12);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)pCVar11);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8),
             CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pCVar11);
  pTVar6 = CTransaction::GetHash(pCVar11);
  pvVar7 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)this_04,(size_type)pCVar12);
  uVar2 = *(undefined8 *)(pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uVar3 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  uVar4 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)((pvVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)((pvVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uVar4;
  *(undefined8 *)(pvVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar2;
  *(undefined8 *)((pvVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uVar3;
  pvVar7 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)this_04,(size_type)pCVar12);
  (pvVar7->prevout).n = 0;
  CScript::CScript((CScript *)pCVar11);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)this_04,(size_type)pCVar12);
  CScript::operator=((CScript *)this_04,(CScript *)pCVar12);
  CScript::~CScript((CScript *)pCVar11);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)this_04,(size_type)pCVar12);
  CScriptWitness::operator=((CScriptWitness *)this_04,(CScriptWitness *)pCVar12);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8),
             CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0));
  pvVar8 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)this_04,(size_type)pCVar12);
  pvVar8->nValue = (CAmount)&DAT_11e1a3000;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)this_04,(size_type)pCVar12);
  CScript::operator=((CScript *)this_04,(CScript *)pCVar12);
  CMutableTransaction::CMutableTransaction
            (in_stack_ffffffffffffd7c8,
             (CMutableTransaction *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)this_04,(size_type)pCVar12);
  CScriptWitness::operator=((CScriptWitness *)this_04,(CScriptWitness *)pCVar12);
  MakeTransactionRef<CMutableTransaction&>(pCVar12);
  MakeTransactionRef<CMutableTransaction&>(pCVar12);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pCVar11);
  ChainstateManager::ProcessTransaction
            (in_stack_ffffffffffffd818,(CTransactionRef *)in_stack_ffffffffffffd810,
             SUB81((ulong)in_stack_ffffffffffffd808 >> 0x38,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_04,(pointer)pCVar12,(unsigned_long)pCVar11);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar11)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
               (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
               (size_t)in_stack_ffffffffffffd7c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
    boost::test_tools::assertion_result::assertion_result(this_04,SUB81((ulong)pCVar12 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_04,(pointer)pCVar12,(unsigned_long)pCVar11);
    boost::unit_test::operator<<((lazy_ostream *)pCVar12,(basic_cstring<const_char> *)pCVar11);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_04,(pointer)pCVar12,(unsigned_long)pCVar11);
    pCVar11 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_17e0,local_1800,local_1820,0x29f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar11);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar11);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
    uVar17 = (undefined1)((ulong)in_stack_ffffffffffffd928 >> 0x38);
  } while (bVar5);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_04,(value_type *)pCVar12);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)this_04,(size_type)pCVar12);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pCVar11,(shared_ptr<const_CTransaction> *)0xb74f46);
  CKey::CKey((CKey *)in_stack_ffffffffffffd7c8,
             (CKey *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
  CScript::CScript((CScript *)pCVar11,(CScript *)0xb74f79);
  this_01 = (CTxMemPool *)&DAT_12a05f138;
  pcVar10 = local_9b8;
  pcVar13 = (char *)((ulong)this_04 & 0xffffffff00000000);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffd948,in_stack_ffffffffffffd940,
             (uint32_t)((ulong)in_stack_ffffffffffffd938 >> 0x20),(int)in_stack_ffffffffffffd938,
             in_stack_ffffffffffffd930,output_destination,(CAmount)output_amount.ptr,(bool)uVar17);
  CScript::~CScript((CScript *)pcVar10);
  CKey::~CKey((CKey *)pcVar10);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar10);
  MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)this_01);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)pcVar13,(value_type *)this_01);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar10)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
               (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
               (size_t)in_stack_ffffffffffffd7c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar10);
    local_18c8 = (CAmount)CTxMemPool::GetMinFee(this_01);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              pcVar13);
    GetVirtualTransactionSize((CTransaction *)pcVar10);
    CFeeRate::GetFee((CFeeRate *)CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8),
                     in_stack_ffffffffffffd7b4);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pcVar13,SUB81((ulong)this_01 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
    boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)pcVar10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
    pcVar10 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_18c0,local_18e8,local_1908,0x2a9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar10);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar10);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar10)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
               (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
               (size_t)in_stack_ffffffffffffd7c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar10);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              pcVar13);
    GetVirtualTransactionSize((CTransaction *)pcVar10);
    CFeeRate::GetFee((CFeeRate *)CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8),
                     in_stack_ffffffffffffd7b4);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pcVar13,SUB81((ulong)this_01 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
    boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)pcVar10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
    pcVar10 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1940,local_1960,local_1980,0x2aa,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar10);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar10);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
    uVar17 = (undefined1)((ulong)in_stack_ffffffffffffd8f0 >> 0x38);
  } while (bVar5);
  GenerateRandomKey(SUB81((ulong)this_01 >> 0x38,0));
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
  WitnessV0KeyHash::WitnessV0KeyHash
            ((WitnessV0KeyHash *)CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0),
             (CPubKey *)pcVar13);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<WitnessV0KeyHash,void,void,WitnessV0KeyHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)pcVar13,(WitnessV0KeyHash *)this_01);
  GetScriptForDestination((CTxDestination *)pcVar10);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)pcVar10);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)pcVar10);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pcVar10);
  CTransaction::GetHash((CTransaction *)pcVar10);
  COutPoint::COutPoint((COutPoint *)pcVar13,(Txid *)this_01,(uint32_t)((ulong)pcVar10 >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8),
             (COutPoint *)CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pcVar10);
  CTransaction::GetHash((CTransaction *)pcVar10);
  COutPoint::COutPoint((COutPoint *)pcVar13,(Txid *)this_01,(uint32_t)((ulong)pcVar10 >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8),
             (COutPoint *)CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pcVar10);
  CTransaction::GetHash((CTransaction *)pcVar10);
  COutPoint::COutPoint((COutPoint *)pcVar13,(Txid *)this_01,(uint32_t)((ulong)pcVar10 >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8),
             (COutPoint *)CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)pcVar13,(size_type)this_01);
  CScriptWitness::operator=((CScriptWitness *)pcVar13,(CScriptWitness *)this_01);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)pcVar13,(size_type)this_01);
  CScriptWitness::operator=((CScriptWitness *)pcVar13,(CScriptWitness *)this_01);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)pcVar13,(size_type)this_01);
  CScriptWitness::operator=((CScriptWitness *)pcVar13,(CScriptWitness *)this_01);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript&>
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8),
             (long *)CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0),
             (CScript *)pcVar13);
  MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)this_01);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)pcVar13,(value_type *)this_01);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar10);
  ChainstateManager::ActiveChainstate((ChainstateManager *)pcVar13);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar13);
  std::optional<CFeeRate>::optional((optional<CFeeRate> *)pcVar10);
  ProcessNewPackage(in_stack_ffffffffffffd820,(CTxMemPool *)in_stack_ffffffffffffd818,
                    in_stack_ffffffffffffd810,(bool)in_stack_ffffffffffffd897,
                    in_stack_ffffffffffffd808);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::get
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar10);
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((Package *)CONCAT17(in_stack_ffffffffffffd907,in_stack_ffffffffffffd900),
             in_stack_ffffffffffffd8f8,(bool)uVar17,
             (CTxMemPool *)CONCAT17(in_stack_ffffffffffffd8ef,in_stack_ffffffffffffd8e8));
  bVar5 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)pcVar10);
  if (bVar5) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                 (size_t)in_stack_ffffffffffffd7c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar13,SUB81((ulong)this_01 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar13);
      boost::unit_test::operator<<
                ((lazy_ostream *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      pcVar10 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1a18,local_1a38,&local_1a48,0x2c3,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)pcVar10);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar10);
      bVar5 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar5);
  }
  else {
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar10);
    CTransaction::GetWitnessHash((CTransaction *)pcVar10);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar10);
    std::
    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            *)this_01,(key_type *)pcVar10);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar10);
    CTransaction::GetWitnessHash((CTransaction *)pcVar10);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar10);
    std::
    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            *)this_01,(key_type *)pcVar10);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar10);
    CTransaction::GetWitnessHash((CTransaction *)pcVar10);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar10);
    std::
    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            *)this_01,(key_type *)pcVar10);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar10);
    CTransaction::GetWitnessHash((CTransaction *)pcVar10);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar10);
    it_child = std::
               map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
               ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                       *)this_01,(key_type *)pcVar10);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                 (size_t)in_stack_ffffffffffffd7c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar10)
      ;
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar13,SUB81((ulong)this_01 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      pcVar10 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1aa0,local_1ac0,local_1ae0,0x2ca,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar10);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar10);
      bVar5 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar5);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                 (size_t)in_stack_ffffffffffffd7c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar10)
      ;
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar13,SUB81((ulong)this_01 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      pcVar10 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1b18,local_1b38,local_1b58,0x2cb,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar10);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar10);
      bVar5 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar5);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                 (size_t)in_stack_ffffffffffffd7c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar10)
      ;
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar13,SUB81((ulong)this_01 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      pcVar10 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1b90,local_1bb0,local_1bd0,0x2cc,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar10);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar10);
      bVar5 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar5);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                 (size_t)in_stack_ffffffffffffd7c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar10)
      ;
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar13,SUB81((ulong)this_01 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      pcVar10 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1c08,local_1c28,local_1c48,0x2cd,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar10);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar10);
      bVar5 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar5);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                 (size_t)in_stack_ffffffffffffd7c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)pcVar10);
      pWVar9 = CTransaction::GetWitnessHash((CTransaction *)pcVar10);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar10)
      ;
      this_01 = (CTxMemPool *)std::optional<uint256>::value((optional<uint256> *)pcVar13);
      pcVar13 = "it_parent2->second.m_other_wtxid.value()";
      pcVar10 = "ptx_parent2_v2->GetWitnessHash()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<true>,uint256>
                (local_1c88,local_1c98,0x2ce,1,2,pWVar9);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar10);
      bVar5 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar5);
    local_1ca8 = 100000000;
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              pcVar13);
    GetVirtualTransactionSize((CTransaction *)pcVar10);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              pcVar13);
    GetVirtualTransactionSize((CTransaction *)pcVar10);
    CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffd7bc,in_stack_ffffffffffffd7b8),
                       (CAmount *)CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0),
                       (uint32_t)((ulong)pcVar13 >> 0x20));
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                 (size_t)in_stack_ffffffffffffd7c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar10)
      ;
      std::optional<CFeeRate>::value((optional<CFeeRate> *)pcVar13);
      ::operator==((CFeeRate *)pcVar13,(CFeeRate *)this_01);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar13,SUB81((ulong)this_01 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      pcVar10 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1ce0,local_1d00,local_1d20,0x2d2,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar10);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar10);
      bVar5 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar5);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                 (size_t)in_stack_ffffffffffffd7c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar10)
      ;
      std::optional<CFeeRate>::value((optional<CFeeRate> *)pcVar13);
      ::operator==((CFeeRate *)pcVar13,(CFeeRate *)this_01);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar13,SUB81((ulong)this_01 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      pcVar10 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1d58,local_1d78,local_1d98,0x2d3,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar10);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar10);
      bVar5 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar5);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar10);
    CTransaction::GetWitnessHash((CTransaction *)pcVar10);
    puVar16 = local_bb8;
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar10);
    pWVar9 = CTransaction::GetWitnessHash((CTransaction *)pcVar10);
    uVar2 = *(undefined8 *)(pWVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems;
    uVar3 = *(undefined8 *)((pWVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
    uVar4 = *(undefined8 *)((pWVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
    puVar16[2] = *(undefined8 *)((pWVar9->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
    puVar16[3] = uVar4;
    *puVar16 = uVar2;
    puVar16[1] = uVar3;
    std::allocator<transaction_identifier<true>_>::allocator
              ((allocator<transaction_identifier<true>_> *)pcVar10);
    __l_06._M_len._0_7_ = in_stack_ffffffffffffd7e8;
    __l_06._M_array = (iterator)in_stack_ffffffffffffd7e0;
    __l_06._M_len._7_1_ = in_stack_ffffffffffffd7ef;
    std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
    vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *)
           in_stack_ffffffffffffd7d8,__l_06,
           (allocator_type *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0));
    std::allocator<transaction_identifier<true>_>::~allocator
              ((allocator<transaction_identifier<true>_> *)pcVar10);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                 (size_t)in_stack_ffffffffffffd7c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar10)
      ;
      std::
      optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
      ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
               *)pcVar13);
      std::operator==((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                       *)in_stack_ffffffffffffd7c8,
                      (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                       *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar13,SUB81((ulong)this_01 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      pcVar10 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1df0,local_1e10,local_1e30,0x2d5,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar10);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar10);
      bVar5 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar5);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd7d8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7d7,in_stack_ffffffffffffd7d0),
                 (size_t)in_stack_ffffffffffffd7c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar10)
      ;
      in_stack_ffffffffffffd7d8 =
           (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)std::
              optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
              ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                       *)pcVar13);
      in_stack_ffffffffffffd7d7 =
           std::operator==((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            *)in_stack_ffffffffffffd7c8,
                           (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            *)CONCAT17(in_stack_ffffffffffffd7c7,in_stack_ffffffffffffd7c0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar13,SUB81((ulong)this_01 >> 0x38,0));
      in_stack_ffffffffffffd7c8 = (CMutableTransaction *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)pcVar10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar13,(pointer)this_01,(unsigned_long)pcVar10);
      pcVar10 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1e68,local_1e88,local_1ea8,0x2d6,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar10);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar10);
      in_stack_ffffffffffffd7c7 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_ffffffffffffd7c7);
    std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
    ~vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *)
            pcVar13);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar10);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)pcVar10);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar10);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar10);
  CScript::~CScript((CScript *)pcVar10);
  CKey::~CKey((CKey *)pcVar10);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar10);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar10);
  MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)pcVar10);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar10);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar10);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar10);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar10);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar10);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar10);
  CScriptWitness::~CScriptWitness((CScriptWitness *)pcVar10);
  CScriptWitness::~CScriptWitness((CScriptWitness *)pcVar10);
  CScript::~CScript((CScript *)pcVar10);
  CScript::~CScript((CScript *)pcVar10);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar10);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar10);
  CScriptWitness::~CScriptWitness((CScriptWitness *)pcVar10);
  CScript::~CScript((CScript *)pcVar10);
  CScript::~CScript((CScript *)pcVar10);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)pcVar13);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar10);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar10);
  CScript::~CScript((CScript *)pcVar10);
  CKey::~CKey((CKey *)pcVar10);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar10);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar10);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar10);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar10);
  CScript::~CScript((CScript *)pcVar10);
  CKey::~CKey((CKey *)pcVar10);
  CScriptWitness::~CScriptWitness((CScriptWitness *)pcVar10);
  CScriptWitness::~CScriptWitness((CScriptWitness *)pcVar10);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar10);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar10);
  CScript::~CScript((CScript *)pcVar10);
  CScript::~CScript((CScript *)pcVar10);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)pcVar10);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(package_witness_swap_tests)
{
    // Mine blocks to mature coinbases.
    mineBlocks(5);
    MockMempoolMinFee(CFeeRate(5000));
    LOCK(cs_main);

    // Transactions with a same-txid-different-witness transaction in the mempool should be ignored,
    // and the mempool entry's wtxid returned.
    CScript witnessScript = CScript() << OP_DROP << OP_TRUE;
    CScript scriptPubKey = GetScriptForDestination(WitnessV0ScriptHash(witnessScript));
    auto mtx_parent = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[0], /*input_vout=*/0,
                                                    /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                    /*output_destination=*/scriptPubKey,
                                                    /*output_amount=*/CAmount(49 * COIN), /*submit=*/false);
    CTransactionRef ptx_parent = MakeTransactionRef(mtx_parent);

    // Make two children with the same txid but different witnesses.
    CScriptWitness witness1;
    witness1.stack.emplace_back(1);
    witness1.stack.emplace_back(witnessScript.begin(), witnessScript.end());

    CScriptWitness witness2(witness1);
    witness2.stack.emplace_back(2);
    witness2.stack.emplace_back(witnessScript.begin(), witnessScript.end());

    CKey child_key = GenerateRandomKey();
    CScript child_locking_script = GetScriptForDestination(WitnessV0KeyHash(child_key.GetPubKey()));
    CMutableTransaction mtx_child1;
    mtx_child1.version = 1;
    mtx_child1.vin.resize(1);
    mtx_child1.vin[0].prevout.hash = ptx_parent->GetHash();
    mtx_child1.vin[0].prevout.n = 0;
    mtx_child1.vin[0].scriptSig = CScript();
    mtx_child1.vin[0].scriptWitness = witness1;
    mtx_child1.vout.resize(1);
    mtx_child1.vout[0].nValue = CAmount(48 * COIN);
    mtx_child1.vout[0].scriptPubKey = child_locking_script;

    CMutableTransaction mtx_child2{mtx_child1};
    mtx_child2.vin[0].scriptWitness = witness2;

    CTransactionRef ptx_child1 = MakeTransactionRef(mtx_child1);
    CTransactionRef ptx_child2 = MakeTransactionRef(mtx_child2);

    // child1 and child2 have the same txid
    BOOST_CHECK_EQUAL(ptx_child1->GetHash(), ptx_child2->GetHash());
    // child1 and child2 have different wtxids
    BOOST_CHECK(ptx_child1->GetWitnessHash() != ptx_child2->GetWitnessHash());
    // Check that they have different package hashes
    BOOST_CHECK(GetPackageHash({ptx_parent, ptx_child1}) != GetPackageHash({ptx_parent, ptx_child2}));

    // Try submitting Package1{parent, child1} and Package2{parent, child2} where the children are
    // same-txid-different-witness.
    {
        Package package_parent_child1{ptx_parent, ptx_child1};
        const auto submit_witness1 = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                       package_parent_child1, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_witness1{CheckPackageMempoolAcceptResult(package_parent_child1, submit_witness1, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_witness1.value());
        }

        // Child2 would have been validated individually.
        Package package_parent_child2{ptx_parent, ptx_child2};
        const auto submit_witness2 = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                       package_parent_child2, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_witness2{CheckPackageMempoolAcceptResult(package_parent_child2, submit_witness2, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_witness2.value());
        } else {
            auto it_parent2_deduped = submit_witness2.m_tx_results.find(ptx_parent->GetWitnessHash());
            auto it_child2 = submit_witness2.m_tx_results.find(ptx_child2->GetWitnessHash());
            BOOST_CHECK(it_parent2_deduped->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
            BOOST_CHECK(it_child2->second.m_result_type == MempoolAcceptResult::ResultType::DIFFERENT_WITNESS);
            BOOST_CHECK_EQUAL(ptx_child1->GetWitnessHash(), it_child2->second.m_other_wtxid.value());
        }

        // Deduplication should work when wtxid != txid. Submit package with the already-in-mempool
        // transactions again, which should not fail.
        const auto submit_segwit_dedup = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                           package_parent_child1, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_segwit_dedup{CheckPackageMempoolAcceptResult(package_parent_child1, submit_segwit_dedup, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_segwit_dedup.value());
        } else {
            auto it_parent_dup = submit_segwit_dedup.m_tx_results.find(ptx_parent->GetWitnessHash());
            auto it_child_dup = submit_segwit_dedup.m_tx_results.find(ptx_child1->GetWitnessHash());
            BOOST_CHECK(it_parent_dup->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
            BOOST_CHECK(it_child_dup->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
        }
    }

    // Try submitting Package1{child2, grandchild} where child2 is same-txid-different-witness as
    // the in-mempool transaction, child1. Since child1 exists in the mempool and its outputs are
    // available, child2 should be ignored and grandchild should be accepted.
    //
    // This tests a potential censorship vector in which an attacker broadcasts a competing package
    // where a parent's witness is mutated. The honest package should be accepted despite the fact
    // that we don't allow witness replacement.
    CKey grandchild_key = GenerateRandomKey();
    CScript grandchild_locking_script = GetScriptForDestination(WitnessV0KeyHash(grandchild_key.GetPubKey()));
    auto mtx_grandchild = CreateValidMempoolTransaction(/*input_transaction=*/ptx_child2, /*input_vout=*/0,
                                                        /*input_height=*/0, /*input_signing_key=*/child_key,
                                                        /*output_destination=*/grandchild_locking_script,
                                                        /*output_amount=*/CAmount(47 * COIN), /*submit=*/false);
    CTransactionRef ptx_grandchild = MakeTransactionRef(mtx_grandchild);
    // Check that they have different package hashes
    BOOST_CHECK(GetPackageHash({ptx_child1, ptx_grandchild}) != GetPackageHash({ptx_child2, ptx_grandchild}));
    // We already submitted child1 above.
    {
        Package package_child2_grandchild{ptx_child2, ptx_grandchild};
        const auto submit_spend_ignored = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                            package_child2_grandchild, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_spend_ignored{CheckPackageMempoolAcceptResult(package_child2_grandchild, submit_spend_ignored, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_spend_ignored.value());
        } else {
            auto it_child2_ignored = submit_spend_ignored.m_tx_results.find(ptx_child2->GetWitnessHash());
            auto it_grandchild = submit_spend_ignored.m_tx_results.find(ptx_grandchild->GetWitnessHash());
            BOOST_CHECK(it_child2_ignored->second.m_result_type == MempoolAcceptResult::ResultType::DIFFERENT_WITNESS);
            BOOST_CHECK(it_grandchild->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
        }
    }

    // A package Package{parent1, parent2, parent3, child} where the parents are a mixture of
    // identical-tx-in-mempool, same-txid-different-witness-in-mempool, and new transactions.
    Package package_mixed;

    // Give all the parents anyone-can-spend scripts so we don't have to deal with signing the child.
    CScript acs_script = CScript() << OP_TRUE;
    CScript acs_spk = GetScriptForDestination(WitnessV0ScriptHash(acs_script));
    CScriptWitness acs_witness;
    acs_witness.stack.emplace_back(acs_script.begin(), acs_script.end());

    // parent1 will already be in the mempool
    auto mtx_parent1 = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[1], /*input_vout=*/0,
                                                     /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                     /*output_destination=*/acs_spk,
                                                     /*output_amount=*/CAmount(49 * COIN), /*submit=*/true);
    CTransactionRef ptx_parent1 = MakeTransactionRef(mtx_parent1);
    package_mixed.push_back(ptx_parent1);

    // parent2 will have a same-txid-different-witness tx already in the mempool
    CScript grandparent2_script = CScript() << OP_DROP << OP_TRUE;
    CScript grandparent2_spk = GetScriptForDestination(WitnessV0ScriptHash(grandparent2_script));
    CScriptWitness parent2_witness1;
    parent2_witness1.stack.emplace_back(1);
    parent2_witness1.stack.emplace_back(grandparent2_script.begin(), grandparent2_script.end());
    CScriptWitness parent2_witness2;
    parent2_witness2.stack.emplace_back(2);
    parent2_witness2.stack.emplace_back(grandparent2_script.begin(), grandparent2_script.end());

    // Create grandparent2 creating an output with multiple spending paths. Submit to mempool.
    auto mtx_grandparent2 = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[2], /*input_vout=*/0,
                                                          /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                          /*output_destination=*/grandparent2_spk,
                                                          /*output_amount=*/CAmount(49 * COIN), /*submit=*/true);
    CTransactionRef ptx_grandparent2 = MakeTransactionRef(mtx_grandparent2);

    CMutableTransaction mtx_parent2_v1;
    mtx_parent2_v1.version = 1;
    mtx_parent2_v1.vin.resize(1);
    mtx_parent2_v1.vin[0].prevout.hash = ptx_grandparent2->GetHash();
    mtx_parent2_v1.vin[0].prevout.n = 0;
    mtx_parent2_v1.vin[0].scriptSig = CScript();
    mtx_parent2_v1.vin[0].scriptWitness = parent2_witness1;
    mtx_parent2_v1.vout.resize(1);
    mtx_parent2_v1.vout[0].nValue = CAmount(48 * COIN);
    mtx_parent2_v1.vout[0].scriptPubKey = acs_spk;

    CMutableTransaction mtx_parent2_v2{mtx_parent2_v1};
    mtx_parent2_v2.vin[0].scriptWitness = parent2_witness2;

    CTransactionRef ptx_parent2_v1 = MakeTransactionRef(mtx_parent2_v1);
    CTransactionRef ptx_parent2_v2 = MakeTransactionRef(mtx_parent2_v2);
    // Put parent2_v1 in the package, submit parent2_v2 to the mempool.
    const MempoolAcceptResult parent2_v2_result = m_node.chainman->ProcessTransaction(ptx_parent2_v2);
    BOOST_CHECK(parent2_v2_result.m_result_type == MempoolAcceptResult::ResultType::VALID);
    package_mixed.push_back(ptx_parent2_v1);

    // parent3 will be a new transaction. Put a low feerate to make it invalid on its own.
    auto mtx_parent3 = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[3], /*input_vout=*/0,
                                                     /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                     /*output_destination=*/acs_spk,
                                                     /*output_amount=*/CAmount(50 * COIN - low_fee_amt), /*submit=*/false);
    CTransactionRef ptx_parent3 = MakeTransactionRef(mtx_parent3);
    package_mixed.push_back(ptx_parent3);
    BOOST_CHECK(m_node.mempool->GetMinFee().GetFee(GetVirtualTransactionSize(*ptx_parent3)) > low_fee_amt);
    BOOST_CHECK(m_node.mempool->m_opts.min_relay_feerate.GetFee(GetVirtualTransactionSize(*ptx_parent3)) <= low_fee_amt);

    // child spends parent1, parent2, and parent3
    CKey mixed_grandchild_key = GenerateRandomKey();
    CScript mixed_child_spk = GetScriptForDestination(WitnessV0KeyHash(mixed_grandchild_key.GetPubKey()));

    CMutableTransaction mtx_mixed_child;
    mtx_mixed_child.vin.emplace_back(COutPoint(ptx_parent1->GetHash(), 0));
    mtx_mixed_child.vin.emplace_back(COutPoint(ptx_parent2_v1->GetHash(), 0));
    mtx_mixed_child.vin.emplace_back(COutPoint(ptx_parent3->GetHash(), 0));
    mtx_mixed_child.vin[0].scriptWitness = acs_witness;
    mtx_mixed_child.vin[1].scriptWitness = acs_witness;
    mtx_mixed_child.vin[2].scriptWitness = acs_witness;
    mtx_mixed_child.vout.emplace_back((48 + 49 + 50 - 1) * COIN, mixed_child_spk);
    CTransactionRef ptx_mixed_child = MakeTransactionRef(mtx_mixed_child);
    package_mixed.push_back(ptx_mixed_child);

    // Submit package:
    // parent1 should be ignored
    // parent2_v1 should be ignored (and v2 wtxid returned)
    // parent3 should be accepted
    // child should be accepted
    {
        const auto mixed_result = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool, package_mixed, false, /*client_maxfeerate=*/{});
        if (auto err_mixed{CheckPackageMempoolAcceptResult(package_mixed, mixed_result, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_mixed.value());
        } else {
            auto it_parent1 = mixed_result.m_tx_results.find(ptx_parent1->GetWitnessHash());
            auto it_parent2 = mixed_result.m_tx_results.find(ptx_parent2_v1->GetWitnessHash());
            auto it_parent3 = mixed_result.m_tx_results.find(ptx_parent3->GetWitnessHash());
            auto it_child = mixed_result.m_tx_results.find(ptx_mixed_child->GetWitnessHash());

            BOOST_CHECK(it_parent1->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
            BOOST_CHECK(it_parent2->second.m_result_type == MempoolAcceptResult::ResultType::DIFFERENT_WITNESS);
            BOOST_CHECK(it_parent3->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
            BOOST_CHECK(it_child->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
            BOOST_CHECK_EQUAL(ptx_parent2_v2->GetWitnessHash(), it_parent2->second.m_other_wtxid.value());

            // package feerate should include parent3 and child. It should not include parent1 or parent2_v1.
            const CFeeRate expected_feerate(1 * COIN, GetVirtualTransactionSize(*ptx_parent3) + GetVirtualTransactionSize(*ptx_mixed_child));
            BOOST_CHECK(it_parent3->second.m_effective_feerate.value() == expected_feerate);
            BOOST_CHECK(it_child->second.m_effective_feerate.value() == expected_feerate);
            std::vector<Wtxid> expected_wtxids({ptx_parent3->GetWitnessHash(), ptx_mixed_child->GetWitnessHash()});
            BOOST_CHECK(it_parent3->second.m_wtxids_fee_calculations.value() == expected_wtxids);
            BOOST_CHECK(it_child->second.m_wtxids_fee_calculations.value() == expected_wtxids);
        }
    }
}